

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SC.cpp
# Opt level: O2

void __thiscall OpenMD::SC::~SC(SC *this)

{
  pointer pSVar1;
  pointer piVar2;
  
  (this->super_MetallicInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction =
       (_func_int **)&PTR__SC_002bcec0;
  this->initialized_ = false;
  std::
  vector<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
  ::clear(&this->MixingMap);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&(this->SCtypes)._M_t);
  pSVar1 = (this->SCdata).
           super__Vector_base<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->SCdata).super__Vector_base<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_>.
      _M_impl.super__Vector_impl_data._M_finish != pSVar1) {
    (this->SCdata).super__Vector_base<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_>.
    _M_impl.super__Vector_impl_data._M_finish = pSVar1;
  }
  piVar2 = (this->SCtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->SCtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (this->SCtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  std::
  _Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  ::~_Rb_tree(&(this->simTypes_)._M_t);
  std::
  vector<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
  ::~vector(&this->MixingMap);
  std::_Vector_base<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_>::~_Vector_base
            (&(this->SCdata).
              super__Vector_base<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->SCtids).super__Vector_base<int,_std::allocator<int>_>);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&(this->SCtypes)._M_t);
  std::__cxx11::string::~string((string *)&this->name_);
  return;
}

Assistant:

SC::~SC() {
    initialized_ = false;

    MixingMap.clear();
    SCtypes.clear();
    SCdata.clear();
    SCtids.clear();
  }